

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

void __thiscall QHostAddress::setScopeId(QHostAddress *this,QString *id)

{
  QHostAddressPrivate *pQVar1;
  
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach(&this->d);
  pQVar1 = (this->d).d.ptr;
  if (pQVar1->protocol == '\x01') {
    QString::operator=(&pQVar1->scopeId,(QString *)id);
    return;
  }
  return;
}

Assistant:

void QHostAddress::setScopeId(const QString &id)
{
    d.detach();
    if (d->protocol == QHostAddress::IPv6Protocol)
        d->scopeId = id;
}